

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

bool __thiscall ON_DimStyle::FontSubstituted(ON_DimStyle *this)

{
  bool bVar1;
  int iVar2;
  undefined1 auStack_28 [16];
  
  bVar1 = true;
  if (this->m_managed_font != (ON_Font *)0x0) {
    iVar2 = ON_Font::CompareFontCharacteristics(this->m_managed_font,&this->m_font_characteristics);
    if (iVar2 == 0) {
      ON_Font::Description((ON_Font *)(auStack_28 + 8));
      ON_Font::Description((ON_Font *)auStack_28);
      bVar1 = ::operator!=((ON_wString *)(auStack_28 + 8),(ON_wString *)auStack_28);
      ON_wString::~ON_wString((ON_wString *)auStack_28);
      ON_wString::~ON_wString((ON_wString *)(auStack_28 + 8));
    }
  }
  return bVar1;
}

Assistant:

const bool ON_DimStyle::FontSubstituted() const
{
  return
    (nullptr == m_managed_font)
    || (0 != ON_Font::CompareFontCharacteristics(*m_managed_font, m_font_characteristics))
    || (m_managed_font->Description() != m_font_characteristics.Description())
    ;
}